

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddSLessThan(InstructionBuilder *this,uint32_t op1,uint32_t op2)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  uint32_t ty_id;
  uint32_t res_id;
  IRContext *pIVar1;
  TypeManager *this_00;
  Instruction *pIVar2;
  IRContext *this_01;
  Operand *local_160;
  allocator<spvtools::opt::Operand> local_155;
  Kind local_154;
  Kind *local_150;
  undefined8 local_148;
  SmallVector<unsigned_int,_2UL> local_140;
  uint local_114;
  iterator local_110;
  undefined8 local_108;
  SmallVector<unsigned_int,_2UL> local_100;
  Operand local_d8;
  Operand OStack_a8;
  iterator local_78;
  _func_int **local_70;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_68;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_50;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> inst;
  undefined1 local_40 [4];
  uint32_t type;
  Bool bool_type;
  uint32_t op2_local;
  uint32_t op1_local;
  InstructionBuilder *this_local;
  
  bool_type.super_Type.kind_ = op2;
  bool_type.super_Type._36_4_ = op1;
  analysis::Bool::Bool((Bool *)local_40);
  pIVar1 = GetContext(this);
  this_00 = IRContext::get_type_mgr(pIVar1);
  inst._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
       analysis::TypeManager::GetId(this_00,(Type *)local_40);
  pIVar2 = (Instruction *)operator_new(0x70);
  pIVar1 = GetContext(this);
  ty_id = inst._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
  this_01 = GetContext(this);
  res_id = IRContext::TakeNextId(this_01);
  local_114 = bool_type.super_Type._36_4_;
  local_110 = &local_114;
  local_108 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_110;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_100,init_list_00);
  Operand::Operand(&local_d8,SPV_OPERAND_TYPE_ID,&local_100);
  local_154 = bool_type.super_Type.kind_;
  local_150 = &local_154;
  local_148 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_150;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_140,init_list);
  Operand::Operand(&OStack_a8,SPV_OPERAND_TYPE_ID,&local_140);
  local_78 = &local_d8;
  local_70 = (_func_int **)0x2;
  std::allocator<spvtools::opt::Operand>::allocator(&local_155);
  __l._M_len = (size_type)local_70;
  __l._M_array = local_78;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_68,__l,&local_155);
  Instruction::Instruction(pIVar2,pIVar1,OpSLessThan,ty_id,res_id,&local_68);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_50,pIVar2);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_68);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_155);
  local_160 = (Operand *)&local_78;
  do {
    local_160 = local_160 + -1;
    Operand::~Operand(local_160);
  } while (local_160 != &local_d8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_140);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_100);
  pIVar2 = AddInstruction(this,&local_50);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_50);
  analysis::Bool::~Bool((Bool *)local_40);
  return pIVar2;
}

Assistant:

Instruction* AddSLessThan(uint32_t op1, uint32_t op2) {
    analysis::Bool bool_type;
    uint32_t type = GetContext()->get_type_mgr()->GetId(&bool_type);
    // TODO(1841): Handle id overflow.
    std::unique_ptr<Instruction> inst(new Instruction(
        GetContext(), spv::Op::OpSLessThan, type, GetContext()->TakeNextId(),
        {{SPV_OPERAND_TYPE_ID, {op1}}, {SPV_OPERAND_TYPE_ID, {op2}}}));
    return AddInstruction(std::move(inst));
  }